

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfHeader.h
# Opt level: O0

TypedAttribute<Imath_3_1::Vec2<float>_> * __thiscall
Imf_3_3::Header::typedAttribute<Imf_3_3::TypedAttribute<Imath_3_1::Vec2<float>>>
          (Header *this,char *name)

{
  Attribute *pAVar1;
  TypedAttribute<Imath_3_1::Vec2<float>_> *this_00;
  char *text;
  TypedAttribute<Imath_3_1::Vec2<float>_> *tattr;
  Attribute *attr;
  char *in_stack_00000278;
  Header *in_stack_00000280;
  
  pAVar1 = operator[](in_stack_00000280,in_stack_00000278);
  if (pAVar1 == (Attribute *)0x0) {
    this_00 = (TypedAttribute<Imath_3_1::Vec2<float>_> *)0x0;
  }
  else {
    this_00 = (TypedAttribute<Imath_3_1::Vec2<float>_> *)
              __dynamic_cast(pAVar1,&Attribute::typeinfo,
                             &TypedAttribute<Imath_3_1::Vec2<float>>::typeinfo,0);
  }
  if (this_00 == (TypedAttribute<Imath_3_1::Vec2<float>_> *)0x0) {
    text = (char *)__cxa_allocate_exception(0x48);
    Iex_3_3::TypeExc::TypeExc((TypeExc *)this_00,text);
    __cxa_throw(text,&Iex_3_3::TypeExc::typeinfo,Iex_3_3::TypeExc::~TypeExc);
  }
  return this_00;
}

Assistant:

T&
Header::typedAttribute (const char name[])
{
    Attribute* attr  = &(*this)[name];
    T*         tattr = dynamic_cast<T*> (attr);

    if (tattr == 0) throw IEX_NAMESPACE::TypeExc ("Unexpected attribute type.");

    return *tattr;
}